

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getEnterVals(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxId enterId,
              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterTest,
              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterUB,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *enterLB,
              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterVal,
              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterMax,
              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterPric,Status *enterStat,
              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterRO,StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *objChange)

{
  uint *puVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  undefined4 uVar4;
  pointer pnVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  Real RVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  bool bVar16;
  int iVar17;
  Status SVar18;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar19;
  cpp_dec_float<100U,_int,_void> *pcVar20;
  Status *pSVar21;
  undefined8 *puVar22;
  cpp_dec_float<100u,int,void> *pcVar23;
  cpp_dec_float<100U,_int,_void> *pcVar24;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar25;
  cpp_dec_float<100U,_int,_void> *pcVar26;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar27;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar28;
  long in_FS_OFFSET;
  undefined4 uVar29;
  uint uVar30;
  undefined4 uVar31;
  long local_500;
  cpp_dec_float<100U,_int,_void> local_4f8;
  cpp_dec_float<100U,_int,_void> *local_4a0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_498;
  undefined8 uStack_490;
  cpp_dec_float<100U,_int,_void> *local_480;
  undefined8 local_478;
  undefined4 uStack_470;
  uint uStack_46c;
  undefined8 local_468;
  undefined8 uStack_460;
  DataKey local_450;
  cpp_dec_float<100U,_int,_void> local_448;
  cpp_dec_float<100u,int,void> local_3f8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  cpp_dec_float<100u,int,void> local_308 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  cpp_dec_float<100u,int,void> local_218 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  cpp_dec_float<100u,int,void> local_128 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_4a0 = &enterLB->m_backend;
  local_498 = this;
  local_480 = &enterVal->m_backend;
  local_478 = &enterUB->m_backend;
  local_450 = enterId.super_DataKey;
  if (enterId.super_DataKey.info < 1) {
    SPxRowId::SPxRowId((SPxRowId *)&local_4f8,(SPxId *)&local_450);
    iVar17 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set,(DataKey *)&local_4f8);
    local_500 = (long)iVar17;
    *enterStat = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.rowstat.data[local_500];
    if (this->theRep == ROW) {
      computePvec((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_4f8,this,iVar17);
      computeTest((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_4f8,local_498,iVar17);
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((enterTest->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)(enterTest->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      (enterTest->m_backend).exp = local_4f8.exp;
      (enterTest->m_backend).neg = local_4f8.neg;
      (enterTest->m_backend).fpclass = local_4f8.fpclass;
      (enterTest->m_backend).prec_elem = local_4f8.prec_elem;
      pVVar19 = &local_498->theTest;
      this = local_498;
    }
    else {
      pVVar19 = &this->theCoTest;
      pnVar5 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterTest->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) = uVar9;
      (enterTest->m_backend).exp = pnVar5[local_500].m_backend.exp;
      (enterTest->m_backend).neg = pnVar5[local_500].m_backend.neg;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      (enterTest->m_backend).fpclass = pnVar5[local_500].m_backend.fpclass;
      (enterTest->m_backend).prec_elem = iVar3;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&(pVVar19->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_500].m_backend,0);
    pcVar20 = local_480;
    switch(*enterStat) {
    case D_FREE:
      ::soplex::infinity::__tls_init();
      local_498 = *(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    **)(in_FS_OFFSET + -8);
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      uStack_490 = 0;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_4f8,(double)local_498);
      pcVar20 = local_480;
      *(undefined8 *)(local_478->data)._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((local_478->data)._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      *(undefined8 *)((local_478->data)._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((local_478->data)._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)((local_478->data)._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((local_478->data)._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((local_478->data)._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((local_478->data)._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      local_478->exp = local_4f8.exp;
      local_478->neg = local_4f8.neg;
      local_478->fpclass = local_4f8.fpclass;
      local_478->prec_elem = local_4f8.prec_elem;
      ::soplex::infinity::__tls_init();
      uStack_46c = uStack_490._4_4_ ^ 0x80000000;
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      local_478 = (cpp_dec_float<100U,_int,_void> *)-(double)local_498;
      uStack_470 = (undefined4)uStack_490;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_4f8,-(double)local_498);
      *(undefined8 *)(local_4a0->data)._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((local_4a0->data)._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      local_4a0->exp = local_4f8.exp;
      local_4a0->neg = local_4f8.neg;
      local_4a0->fpclass = local_4f8.fpclass;
      local_4a0->prec_elem = local_4f8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(pcVar20,0);
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend + 8);
      uVar10 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x10);
      uVar11 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x18);
      uVar12 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x20);
      uVar13 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x28);
      uVar14 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x38);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xc) =
           *(undefined8 *)((long)(pnVar5 + local_500) + 0x30);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + local_500) + 0x40);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + local_500) + 0x44);
      uVar6 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x48);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar9 = *(undefined8 *)puVar1;
      uVar10 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar11 = *(undefined8 *)puVar1;
      uVar12 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar13 = *(undefined8 *)puVar1;
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)(enterRO->m_backend).data._M_elems =
           *(undefined8 *)&pnVar5[local_500].m_backend.data;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar9;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar11;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar12;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = uVar13;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
      (enterRO->m_backend).exp = pnVar5[local_500].m_backend.exp;
      (enterRO->m_backend).neg = pnVar5[local_500].m_backend.neg;
      uVar4 = pnVar5[local_500].m_backend.fpclass;
      uVar7 = pnVar5[local_500].m_backend.prec_elem;
      (enterRO->m_backend).fpclass = uVar4;
      (enterRO->m_backend).prec_elem = uVar7;
      if ((((enterPric->m_backend).fpclass == cpp_dec_float_NaN) || (uVar4 == 2)) ||
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&enterPric->m_backend,&enterRO->m_backend), iVar17 < 1)) {
        uStack_490 = CONCAT44(uStack_46c,uStack_470);
        local_498 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_478;
      }
      ::soplex::infinity::__tls_init();
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_4f8,(double)local_498);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      (enterMax->m_backend).exp = local_4f8.exp;
      (enterMax->m_backend).neg = local_4f8.neg;
      (enterMax->m_backend).fpclass = local_4f8.fpclass;
      (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
      pSVar21 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_003a0f18;
    case D_ON_UPPER:
      pnVar5 = (this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_478->data)._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_478->data)._M_elems + 0xe) = uVar14;
      *(undefined8 *)((local_478->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((local_478->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((local_478->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((local_478->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(local_478->data)._M_elems = uVar6;
      *(undefined8 *)((local_478->data)._M_elems + 2) = uVar9;
      local_478->exp = pnVar5[local_500].m_backend.exp;
      local_478->neg = pnVar5[local_500].m_backend.neg;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      local_478->fpclass = pnVar5[local_500].m_backend.fpclass;
      local_478->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      local_498 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((ulong)*(double *)(in_FS_OFFSET + -8) ^ 0x8000000000000000);
      uStack_490 = 0x8000000000000000;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_4f8,-*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(local_4a0->data)._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((local_4a0->data)._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      local_4a0->exp = local_4f8.exp;
      local_4a0->neg = local_4f8.neg;
      local_4a0->fpclass = local_4f8.fpclass;
      local_4a0->prec_elem = local_4f8.prec_elem;
      uVar6 = *(undefined8 *)(local_478->data)._M_elems;
      uVar9 = *(undefined8 *)((local_478->data)._M_elems + 2);
      uVar10 = *(undefined8 *)((local_478->data)._M_elems + 4);
      uVar11 = *(undefined8 *)((local_478->data)._M_elems + 6);
      uVar12 = *(undefined8 *)((local_478->data)._M_elems + 8);
      uVar13 = *(undefined8 *)((local_478->data)._M_elems + 10);
      uVar14 = *(undefined8 *)((local_478->data)._M_elems + 0xe);
      *(undefined8 *)((local_480->data)._M_elems + 0xc) =
           *(undefined8 *)((local_478->data)._M_elems + 0xc);
      *(undefined8 *)((local_480->data)._M_elems + 0xe) = uVar14;
      *(undefined8 *)((local_480->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((local_480->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((local_480->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((local_480->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(local_480->data)._M_elems = uVar6;
      *(undefined8 *)((local_480->data)._M_elems + 2) = uVar9;
      local_480->exp = local_478->exp;
      local_480->neg = local_478->neg;
      iVar3 = local_478->prec_elem;
      local_480->fpclass = local_478->fpclass;
      local_480->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_4f8,(double)local_498);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      (enterMax->m_backend).exp = local_4f8.exp;
      (enterMax->m_backend).neg = local_4f8.neg;
      (enterMax->m_backend).fpclass = local_4f8.fpclass;
      (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend + 8);
      uVar10 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x10);
      uVar11 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x18);
      uVar12 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x20);
      uVar13 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x28);
      uVar14 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x38);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xc) =
           *(undefined8 *)((long)(pnVar5 + local_500) + 0x30);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + local_500) + 0x40);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + local_500) + 0x44);
      uVar6 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x48);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      iVar17 = pnVar5[local_500].m_backend.exp;
      (enterRO->m_backend).exp = iVar17;
      bVar16 = pnVar5[local_500].m_backend.neg;
      (enterRO->m_backend).neg = bVar16;
      fVar2 = pnVar5[local_500].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      pcVar20 = &enterRO->m_backend;
      if ((&local_4f8 != local_480) && (pcVar20 = local_480, &local_4f8 != &enterRO->m_backend)) {
        local_4f8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_4f8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_4f8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        local_4f8.data._M_elems._24_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_4f8.data._M_elems._32_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_4f8.data._M_elems._40_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 10);
        local_4f8.data._M_elems._48_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe);
        local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
        local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_4f8.prec_elem = iVar3;
        local_4f8.fpclass = fVar2;
        local_4f8.exp = iVar17;
        local_4f8.neg = bVar16;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_4f8,pcVar20);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                ((cpp_dec_float<100U,_int,_void> *)objChange,&local_4f8);
      pSVar21 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_003a14f7;
    case D_ON_LOWER:
      pnVar5 = (this->theLRbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_4a0->data)._M_elems + 0xe) = uVar14;
      *(undefined8 *)((local_4a0->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((local_4a0->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((local_4a0->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((local_4a0->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(local_4a0->data)._M_elems = uVar6;
      *(undefined8 *)((local_4a0->data)._M_elems + 2) = uVar9;
      local_4a0->exp = pnVar5[local_500].m_backend.exp;
      local_4a0->neg = pnVar5[local_500].m_backend.neg;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      local_4a0->fpclass = pnVar5[local_500].m_backend.fpclass;
      local_4a0->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_498 = *(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    **)(in_FS_OFFSET + -8);
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_4f8,(double)local_498);
      *(undefined8 *)(local_478->data)._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((local_478->data)._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      *(undefined8 *)((local_478->data)._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((local_478->data)._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)((local_478->data)._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((local_478->data)._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((local_478->data)._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((local_478->data)._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      local_478->exp = local_4f8.exp;
      local_478->neg = local_4f8.neg;
      local_478->fpclass = local_4f8.fpclass;
      local_478->prec_elem = local_4f8.prec_elem;
      uVar6 = *(undefined8 *)(local_4a0->data)._M_elems;
      uVar9 = *(undefined8 *)((local_4a0->data)._M_elems + 2);
      uVar10 = *(undefined8 *)((local_4a0->data)._M_elems + 4);
      uVar11 = *(undefined8 *)((local_4a0->data)._M_elems + 6);
      uVar12 = *(undefined8 *)((local_4a0->data)._M_elems + 8);
      uVar13 = *(undefined8 *)((local_4a0->data)._M_elems + 10);
      uVar14 = *(undefined8 *)((local_4a0->data)._M_elems + 0xe);
      *(undefined8 *)((local_480->data)._M_elems + 0xc) =
           *(undefined8 *)((local_4a0->data)._M_elems + 0xc);
      *(undefined8 *)((local_480->data)._M_elems + 0xe) = uVar14;
      *(undefined8 *)((local_480->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((local_480->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((local_480->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((local_480->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(local_480->data)._M_elems = uVar6;
      *(undefined8 *)((local_480->data)._M_elems + 2) = uVar9;
      local_480->exp = local_4a0->exp;
      local_480->neg = local_4a0->neg;
      iVar3 = local_4a0->prec_elem;
      local_480->fpclass = local_4a0->fpclass;
      local_480->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_4f8,(double)local_498);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      (enterMax->m_backend).exp = local_4f8.exp;
      (enterMax->m_backend).neg = local_4f8.neg;
      (enterMax->m_backend).fpclass = local_4f8.fpclass;
      (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend + 8);
      uVar10 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x10);
      uVar11 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x18);
      uVar12 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x20);
      uVar13 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x28);
      uVar14 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x38);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xc) =
           *(undefined8 *)((long)(pnVar5 + local_500) + 0x30);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + local_500) + 0x40);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + local_500) + 0x44);
      uVar6 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x48);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      iVar17 = pnVar5[local_500].m_backend.exp;
      (enterRO->m_backend).exp = iVar17;
      bVar16 = pnVar5[local_500].m_backend.neg;
      (enterRO->m_backend).neg = bVar16;
      fVar2 = pnVar5[local_500].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      pcVar20 = &enterRO->m_backend;
      if ((&local_4f8 != local_480) && (pcVar20 = local_480, &local_4f8 != &enterRO->m_backend)) {
        local_4f8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_4f8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_4f8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        local_4f8.data._M_elems._24_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_4f8.data._M_elems._32_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_4f8.data._M_elems._40_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 10);
        local_4f8.data._M_elems._48_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe);
        local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
        local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_4f8.prec_elem = iVar3;
        local_4f8.fpclass = fVar2;
        local_4f8.exp = iVar17;
        local_4f8.neg = bVar16;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_4f8,pcVar20);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                ((cpp_dec_float<100U,_int,_void> *)objChange,&local_4f8);
      pSVar21 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_003a1402;
    case D_ON_BOTH:
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend + 8);
      uVar10 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x10);
      uVar11 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x18);
      uVar12 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x20);
      uVar13 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x28);
      uVar14 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x38);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xc) =
           *(undefined8 *)((long)(pnVar5 + local_500) + 0x30);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + local_500) + 0x40);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + local_500) + 0x44);
      uVar6 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x48);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      if ((((int)uVar6 == 2) ||
          (pnVar5 = (this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pnVar5[local_500].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&enterPric->m_backend,&pnVar5[local_500].m_backend), iVar17 < 1)) {
        pnVar5 = (this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
        uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
        uVar10 = *(undefined8 *)puVar1;
        uVar11 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
        uVar12 = *(undefined8 *)puVar1;
        uVar13 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
        uVar14 = *(undefined8 *)puVar1;
        uVar15 = *(undefined8 *)(puVar1 + 2);
        *(undefined8 *)((local_478->data)._M_elems + 0xc) = uVar14;
        *(undefined8 *)((local_478->data)._M_elems + 0xe) = uVar15;
        *(undefined8 *)((local_478->data)._M_elems + 8) = uVar12;
        *(undefined8 *)((local_478->data)._M_elems + 10) = uVar13;
        *(undefined8 *)((local_478->data)._M_elems + 4) = uVar10;
        *(undefined8 *)((local_478->data)._M_elems + 6) = uVar11;
        *(undefined8 *)(local_478->data)._M_elems = uVar6;
        *(undefined8 *)((local_478->data)._M_elems + 2) = uVar9;
        local_478->exp = pnVar5[local_500].m_backend.exp;
        local_478->neg = pnVar5[local_500].m_backend.neg;
        iVar3 = pnVar5[local_500].m_backend.prec_elem;
        local_478->fpclass = pnVar5[local_500].m_backend.fpclass;
        local_478->prec_elem = iVar3;
        *(undefined8 *)((local_480->data)._M_elems + 0xc) = uVar14;
        *(undefined8 *)((local_480->data)._M_elems + 0xe) = uVar15;
        *(undefined8 *)((local_480->data)._M_elems + 8) = uVar12;
        *(undefined8 *)((local_480->data)._M_elems + 10) = uVar13;
        *(undefined8 *)((local_480->data)._M_elems + 4) = uVar10;
        *(undefined8 *)((local_480->data)._M_elems + 6) = uVar11;
        *(undefined8 *)(local_480->data)._M_elems = uVar6;
        *(undefined8 *)((local_480->data)._M_elems + 2) = uVar9;
        local_480->exp = local_478->exp;
        local_480->neg = local_478->neg;
        iVar3 = local_478->prec_elem;
        local_480->fpclass = local_478->fpclass;
        local_480->prec_elem = iVar3;
        ::soplex::infinity::__tls_init();
        local_4f8.fpclass = cpp_dec_float_finite;
        local_4f8.prec_elem = 0x10;
        local_4f8.data._M_elems[0] = 0;
        local_4f8.data._M_elems[1] = 0;
        local_4f8.data._M_elems[2] = 0;
        local_4f8.data._M_elems[3] = 0;
        local_4f8.data._M_elems[4] = 0;
        local_4f8.data._M_elems[5] = 0;
        local_4f8.data._M_elems[6] = 0;
        local_4f8.data._M_elems[7] = 0;
        local_4f8.data._M_elems[8] = 0;
        local_4f8.data._M_elems[9] = 0;
        local_4f8.data._M_elems[10] = 0;
        local_4f8.data._M_elems[0xb] = 0;
        local_4f8.data._M_elems[0xc] = 0;
        local_4f8.data._M_elems[0xd] = 0;
        local_4f8.data._M_elems._56_5_ = 0;
        local_4f8.data._M_elems[0xf]._1_3_ = 0;
        local_4f8.exp = 0;
        local_4f8.neg = false;
        local_478 = (cpp_dec_float<100U,_int,_void> *)
                    ((ulong)*(double *)(in_FS_OFFSET + -8) ^ 0x8000000000000000);
        uStack_470 = 0;
        uStack_46c = 0x80000000;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_4f8,-*(double *)(in_FS_OFFSET + -8));
        *(undefined8 *)(local_4a0->data)._M_elems = local_4f8.data._M_elems._0_8_;
        *(undefined8 *)((local_4a0->data)._M_elems + 2) = local_4f8.data._M_elems._8_8_;
        *(undefined8 *)((local_4a0->data)._M_elems + 4) = local_4f8.data._M_elems._16_8_;
        *(undefined8 *)((local_4a0->data)._M_elems + 6) = local_4f8.data._M_elems._24_8_;
        *(undefined8 *)((local_4a0->data)._M_elems + 8) = local_4f8.data._M_elems._32_8_;
        *(undefined8 *)((local_4a0->data)._M_elems + 10) = local_4f8.data._M_elems._40_8_;
        *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
        *(ulong *)((local_4a0->data)._M_elems + 0xe) =
             CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
        local_4a0->exp = local_4f8.exp;
        local_4a0->neg = local_4f8.neg;
        local_4a0->fpclass = local_4f8.fpclass;
        local_4a0->prec_elem = local_4f8.prec_elem;
        ::soplex::infinity::__tls_init();
        local_4f8.fpclass = cpp_dec_float_finite;
        local_4f8.prec_elem = 0x10;
        local_4f8.data._M_elems[0] = 0;
        local_4f8.data._M_elems[1] = 0;
        local_4f8.data._M_elems[2] = 0;
        local_4f8.data._M_elems[3] = 0;
        local_4f8.data._M_elems[4] = 0;
        local_4f8.data._M_elems[5] = 0;
        local_4f8.data._M_elems[6] = 0;
        local_4f8.data._M_elems[7] = 0;
        local_4f8.data._M_elems[8] = 0;
        local_4f8.data._M_elems[9] = 0;
        local_4f8.data._M_elems[10] = 0;
        local_4f8.data._M_elems[0xb] = 0;
        local_4f8.data._M_elems[0xc] = 0;
        local_4f8.data._M_elems[0xd] = 0;
        local_4f8.data._M_elems._56_5_ = 0;
        local_4f8.data._M_elems[0xf]._1_3_ = 0;
        local_4f8.exp = 0;
        local_4f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_4f8,(double)local_478);
        *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
        *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
             CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
        (enterMax->m_backend).exp = local_4f8.exp;
        (enterMax->m_backend).neg = local_4f8.neg;
        (enterMax->m_backend).fpclass = local_4f8.fpclass;
        (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
        pVVar19 = &(local_498->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left;
        SVar18 = P_ON_LOWER;
        pSVar25 = local_498;
      }
      else {
        pnVar5 = (this->theLRbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
        uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
        uVar10 = *(undefined8 *)puVar1;
        uVar11 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
        uVar12 = *(undefined8 *)puVar1;
        uVar13 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
        uVar14 = *(undefined8 *)puVar1;
        uVar15 = *(undefined8 *)(puVar1 + 2);
        *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = uVar14;
        *(undefined8 *)((local_4a0->data)._M_elems + 0xe) = uVar15;
        *(undefined8 *)((local_4a0->data)._M_elems + 8) = uVar12;
        *(undefined8 *)((local_4a0->data)._M_elems + 10) = uVar13;
        *(undefined8 *)((local_4a0->data)._M_elems + 4) = uVar10;
        *(undefined8 *)((local_4a0->data)._M_elems + 6) = uVar11;
        *(undefined8 *)(local_4a0->data)._M_elems = uVar6;
        *(undefined8 *)((local_4a0->data)._M_elems + 2) = uVar9;
        local_4a0->exp = pnVar5[local_500].m_backend.exp;
        local_4a0->neg = pnVar5[local_500].m_backend.neg;
        iVar3 = pnVar5[local_500].m_backend.prec_elem;
        local_4a0->fpclass = pnVar5[local_500].m_backend.fpclass;
        local_4a0->prec_elem = iVar3;
        *(undefined8 *)((local_480->data)._M_elems + 0xc) = uVar14;
        *(undefined8 *)((local_480->data)._M_elems + 0xe) = uVar15;
        *(undefined8 *)((local_480->data)._M_elems + 8) = uVar12;
        *(undefined8 *)((local_480->data)._M_elems + 10) = uVar13;
        *(undefined8 *)((local_480->data)._M_elems + 4) = uVar10;
        *(undefined8 *)((local_480->data)._M_elems + 6) = uVar11;
        *(undefined8 *)(local_480->data)._M_elems = uVar6;
        *(undefined8 *)((local_480->data)._M_elems + 2) = uVar9;
        local_480->exp = local_4a0->exp;
        local_480->neg = local_4a0->neg;
        iVar3 = local_4a0->prec_elem;
        local_480->fpclass = local_4a0->fpclass;
        local_480->prec_elem = iVar3;
        ::soplex::infinity::__tls_init();
        local_4a0 = *(cpp_dec_float<100U,_int,_void> **)(in_FS_OFFSET + -8);
        local_4f8.fpclass = cpp_dec_float_finite;
        local_4f8.prec_elem = 0x10;
        local_4f8.data._M_elems[0] = 0;
        local_4f8.data._M_elems[1] = 0;
        local_4f8.data._M_elems[2] = 0;
        local_4f8.data._M_elems[3] = 0;
        local_4f8.data._M_elems[4] = 0;
        local_4f8.data._M_elems[5] = 0;
        local_4f8.data._M_elems[6] = 0;
        local_4f8.data._M_elems[7] = 0;
        local_4f8.data._M_elems[8] = 0;
        local_4f8.data._M_elems[9] = 0;
        local_4f8.data._M_elems[10] = 0;
        local_4f8.data._M_elems[0xb] = 0;
        local_4f8.data._M_elems[0xc] = 0;
        local_4f8.data._M_elems[0xd] = 0;
        local_4f8.data._M_elems._56_5_ = 0;
        local_4f8.data._M_elems[0xf]._1_3_ = 0;
        local_4f8.exp = 0;
        local_4f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_4f8,(double)local_4a0);
        *(undefined8 *)(local_478->data)._M_elems = local_4f8.data._M_elems._0_8_;
        *(undefined8 *)((local_478->data)._M_elems + 2) = local_4f8.data._M_elems._8_8_;
        *(undefined8 *)((local_478->data)._M_elems + 4) = local_4f8.data._M_elems._16_8_;
        *(undefined8 *)((local_478->data)._M_elems + 6) = local_4f8.data._M_elems._24_8_;
        *(undefined8 *)((local_478->data)._M_elems + 8) = local_4f8.data._M_elems._32_8_;
        *(undefined8 *)((local_478->data)._M_elems + 10) = local_4f8.data._M_elems._40_8_;
        *(undefined8 *)((local_478->data)._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
        *(ulong *)((local_478->data)._M_elems + 0xe) =
             CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
        local_478->exp = local_4f8.exp;
        local_478->neg = local_4f8.neg;
        local_478->fpclass = local_4f8.fpclass;
        local_478->prec_elem = local_4f8.prec_elem;
        ::soplex::infinity::__tls_init();
        pSVar25 = local_498;
        pVVar19 = &(local_498->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right;
        local_4f8.fpclass = cpp_dec_float_finite;
        local_4f8.prec_elem = 0x10;
        local_4f8.data._M_elems[0] = 0;
        local_4f8.data._M_elems[1] = 0;
        local_4f8.data._M_elems[2] = 0;
        local_4f8.data._M_elems[3] = 0;
        local_4f8.data._M_elems[4] = 0;
        local_4f8.data._M_elems[5] = 0;
        local_4f8.data._M_elems[6] = 0;
        local_4f8.data._M_elems[7] = 0;
        local_4f8.data._M_elems[8] = 0;
        local_4f8.data._M_elems[9] = 0;
        local_4f8.data._M_elems[10] = 0;
        local_4f8.data._M_elems[0xb] = 0;
        local_4f8.data._M_elems[0xc] = 0;
        local_4f8.data._M_elems[0xd] = 0;
        local_4f8.data._M_elems._56_5_ = 0;
        local_4f8.data._M_elems[0xf]._1_3_ = 0;
        local_4f8.exp = 0;
        local_4f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_4f8,(double)local_4a0);
        *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
        *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
             CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
        (enterMax->m_backend).exp = local_4f8.exp;
        (enterMax->m_backend).neg = local_4f8.neg;
        (enterMax->m_backend).fpclass = local_4f8.fpclass;
        (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
        SVar18 = P_ON_UPPER;
      }
      pnVar5 = (pVVar19->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      (enterRO->m_backend).exp = pnVar5[local_500].m_backend.exp;
      (enterRO->m_backend).neg = pnVar5[local_500].m_backend.neg;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      (enterRO->m_backend).fpclass = pnVar5[local_500].m_backend.fpclass;
      (enterRO->m_backend).prec_elem = iVar3;
      (pSVar25->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[local_500] = SVar18;
      pcVar24 = &(pSVar25->theLRbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_500].m_backend;
      pcVar26 = &(pSVar25->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_500].m_backend;
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      pcVar20 = pcVar24;
      if ((&local_4f8 != pcVar26) && (pcVar20 = pcVar26, &local_4f8 != pcVar24)) {
        local_4f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar24->data)._M_elems;
        local_4f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 2);
        local_4f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 4);
        local_4f8.data._M_elems._24_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 6);
        local_4f8.data._M_elems._32_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 8);
        local_4f8.data._M_elems._40_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 10);
        local_4f8.data._M_elems._48_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 0xc);
        uVar6 = *(undefined8 *)((pcVar24->data)._M_elems + 0xe);
        local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
        local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_4f8.exp = pcVar24->exp;
        local_4f8.neg = pcVar24->neg;
        local_4f8.fpclass = pcVar24->fpclass;
        local_4f8.prec_elem = pcVar24->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_4f8,pcVar20);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                ((cpp_dec_float<100U,_int,_void> *)objChange,&local_4f8);
      pcVar20 = &(local_498->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_500].m_backend;
      pcVar24 = &(local_498->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_500].m_backend;
      goto LAB_003a144d;
    case P_ON_LOWER:
      pnVar5 = (this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_478->data)._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_478->data)._M_elems + 0xe) = uVar14;
      *(undefined8 *)((local_478->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((local_478->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((local_478->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((local_478->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(local_478->data)._M_elems = uVar6;
      *(undefined8 *)((local_478->data)._M_elems + 2) = uVar9;
      local_478->exp = pnVar5[local_500].m_backend.exp;
      local_478->neg = pnVar5[local_500].m_backend.neg;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      local_478->fpclass = pnVar5[local_500].m_backend.fpclass;
      local_478->prec_elem = iVar3;
      pnVar5 = (this->theLRbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_4a0->data)._M_elems + 0xe) = uVar14;
      *(undefined8 *)((local_4a0->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((local_4a0->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((local_4a0->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((local_4a0->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(local_4a0->data)._M_elems = uVar6;
      *(undefined8 *)((local_4a0->data)._M_elems + 2) = uVar9;
      local_4a0->exp = pnVar5[local_500].m_backend.exp;
      local_4a0->neg = pnVar5[local_500].m_backend.neg;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      local_4a0->fpclass = pnVar5[local_500].m_backend.fpclass;
      local_4a0->prec_elem = iVar3;
      uVar6 = *(undefined8 *)(local_478->data)._M_elems;
      uVar9 = *(undefined8 *)((local_478->data)._M_elems + 2);
      uVar10 = *(undefined8 *)((local_478->data)._M_elems + 4);
      uVar11 = *(undefined8 *)((local_478->data)._M_elems + 6);
      uVar12 = *(undefined8 *)((local_478->data)._M_elems + 8);
      uVar13 = *(undefined8 *)((local_478->data)._M_elems + 10);
      uVar14 = *(undefined8 *)((local_478->data)._M_elems + 0xe);
      *(undefined8 *)((local_480->data)._M_elems + 0xc) =
           *(undefined8 *)((local_478->data)._M_elems + 0xc);
      *(undefined8 *)((local_480->data)._M_elems + 0xe) = uVar14;
      *(undefined8 *)((local_480->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((local_480->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((local_480->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((local_480->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(local_480->data)._M_elems = uVar6;
      *(undefined8 *)((local_480->data)._M_elems + 2) = uVar9;
      local_480->exp = local_478->exp;
      local_480->neg = local_478->neg;
      iVar3 = local_478->prec_elem;
      local_480->fpclass = local_478->fpclass;
      local_480->prec_elem = iVar3;
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      if (&local_4f8 == local_478) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_4f8,local_4a0);
        if (local_4f8.data._M_elems[0] != 0 || local_4f8.fpclass != cpp_dec_float_finite) {
          local_4f8.neg = (bool)(local_4f8.neg ^ 1);
        }
      }
      else {
        if (&local_4f8 != local_4a0) {
          local_4f8.data._M_elems._0_8_ = *(undefined8 *)(local_4a0->data)._M_elems;
          local_4f8.data._M_elems._8_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 2);
          local_4f8.data._M_elems._16_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 4);
          local_4f8.data._M_elems._24_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 6);
          local_4f8.data._M_elems._32_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 8);
          local_4f8.data._M_elems._40_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 10);
          local_4f8.data._M_elems._48_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 0xc);
          uVar6 = *(undefined8 *)((local_4a0->data)._M_elems + 0xe);
          local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
          local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_4f8.exp = local_4a0->exp;
          local_4f8.neg = local_4a0->neg;
          local_4f8.fpclass = local_4a0->fpclass;
          local_4f8.prec_elem = local_4a0->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_4f8,local_478);
      }
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      (enterMax->m_backend).exp = local_4f8.exp;
      (enterMax->m_backend).neg = local_4f8.neg;
      (enterMax->m_backend).fpclass = local_4f8.fpclass;
      (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
      pnVar5 = (local_498->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend + 8);
      uVar10 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x10);
      uVar11 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x18);
      uVar12 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x20);
      uVar13 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x28);
      uVar14 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x38);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xc) =
           *(undefined8 *)((long)(pnVar5 + local_500) + 0x30);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + local_500) + 0x40);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + local_500) + 0x44);
      uVar6 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x48);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (local_498->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      iVar17 = pnVar5[local_500].m_backend.exp;
      (enterRO->m_backend).exp = iVar17;
      bVar16 = pnVar5[local_500].m_backend.neg;
      (enterRO->m_backend).neg = bVar16;
      fVar2 = pnVar5[local_500].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      pcVar24 = &enterRO->m_backend;
      if ((&local_4f8 != pcVar20) && (pcVar24 = pcVar20, &local_4f8 != &enterRO->m_backend)) {
        local_4f8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_4f8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_4f8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        local_4f8.data._M_elems._24_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_4f8.data._M_elems._32_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_4f8.data._M_elems._40_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 10);
        local_4f8.data._M_elems._48_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe);
        local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
        local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_4f8.prec_elem = iVar3;
        local_4f8.fpclass = fVar2;
        local_4f8.exp = iVar17;
        local_4f8.neg = bVar16;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_4f8,pcVar24);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                ((cpp_dec_float<100U,_int,_void> *)objChange,&local_4f8);
      ::soplex::infinity::__tls_init();
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_4f8,-*(double *)(in_FS_OFFSET + -8));
      pcVar20 = local_4a0;
      local_358.m_backend.fpclass = local_4a0->fpclass;
      if ((local_358.m_backend.fpclass != cpp_dec_float_NaN) &&
         (local_4f8.fpclass != cpp_dec_float_NaN)) {
        iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (local_4a0,&local_4f8);
        if (iVar17 < 1) {
          pSVar21 = (local_498->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data;
          goto LAB_003a2048;
        }
        local_358.m_backend.fpclass = pcVar20->fpclass;
      }
      pSVar25 = local_498;
      local_358.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
      local_358.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
      local_358.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
      local_358.m_backend.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
      local_358.m_backend.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
      local_358.m_backend.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
      local_358.m_backend.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
      local_358.m_backend.data._M_elems._56_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
      pnVar27 = &local_358;
      local_358.m_backend.exp = pcVar20->exp;
      local_358.m_backend.neg = pcVar20->neg;
      local_358.m_backend.prec_elem = pcVar20->prec_elem;
      local_3a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_478->data)._M_elems;
      local_3a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_478->data)._M_elems + 2);
      local_3a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_478->data)._M_elems + 4);
      local_3a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_478->data)._M_elems + 6);
      local_3a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_478->data)._M_elems + 8);
      local_3a8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((local_478->data)._M_elems + 10);
      local_3a8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((local_478->data)._M_elems + 0xc);
      local_3a8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((local_478->data)._M_elems + 0xe);
      pnVar28 = &local_3a8;
      local_3a8.m_backend.exp = local_478->exp;
      local_3a8.m_backend.neg = local_478->neg;
      local_3a8.m_backend.fpclass = local_478->fpclass;
      local_3a8.m_backend.prec_elem = local_478->prec_elem;
      RVar8 = Tolerances::epsilon((local_498->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      uVar29 = SUB84(RVar8,0);
      uVar31 = (undefined4)((ulong)RVar8 >> 0x20);
      pcVar23 = local_3f8;
      break;
    default:
      puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_4f8.data._M_elems._0_8_ = local_4f8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4f8,"XENTER03 This should never happen.","");
      *puVar22 = &PTR__SPxException_0069d438;
      puVar22[1] = puVar22 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar22 + 1),local_4f8.data._M_elems._0_8_,
                 local_4f8.data._M_elems._0_8_ + local_4f8.data._M_elems._8_8_);
      *puVar22 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar22,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
      pnVar5 = (this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_478->data)._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_478->data)._M_elems + 0xe) = uVar14;
      *(undefined8 *)((local_478->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((local_478->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((local_478->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((local_478->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(local_478->data)._M_elems = uVar6;
      *(undefined8 *)((local_478->data)._M_elems + 2) = uVar9;
      local_478->exp = pnVar5[local_500].m_backend.exp;
      local_478->neg = pnVar5[local_500].m_backend.neg;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      local_478->fpclass = pnVar5[local_500].m_backend.fpclass;
      local_478->prec_elem = iVar3;
      pnVar5 = (this->theLRbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)puVar1;
      uVar15 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = uVar14;
      *(undefined8 *)((local_4a0->data)._M_elems + 0xe) = uVar15;
      *(undefined8 *)((local_4a0->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((local_4a0->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((local_4a0->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((local_4a0->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(local_4a0->data)._M_elems = uVar6;
      *(undefined8 *)((local_4a0->data)._M_elems + 2) = uVar9;
      local_4a0->exp = pnVar5[local_500].m_backend.exp;
      local_4a0->neg = pnVar5[local_500].m_backend.neg;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      local_4a0->fpclass = pnVar5[local_500].m_backend.fpclass;
      local_4a0->prec_elem = iVar3;
      *(undefined8 *)((local_480->data)._M_elems + 0xc) = uVar14;
      *(undefined8 *)((local_480->data)._M_elems + 0xe) = uVar15;
      *(undefined8 *)((local_480->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((local_480->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((local_480->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((local_480->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(local_480->data)._M_elems = uVar6;
      *(undefined8 *)((local_480->data)._M_elems + 2) = uVar9;
      local_480->exp = local_4a0->exp;
      local_480->neg = local_4a0->neg;
      iVar3 = local_4a0->prec_elem;
      local_480->fpclass = local_4a0->fpclass;
      local_480->prec_elem = iVar3;
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      if (&local_4f8 == local_4a0) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_4f8,local_478);
        if (local_4f8.data._M_elems[0] != 0 || local_4f8.fpclass != cpp_dec_float_finite) {
          local_4f8.neg = (bool)(local_4f8.neg ^ 1);
        }
      }
      else {
        if (&local_4f8 != local_478) {
          local_4f8.data._M_elems._0_8_ = *(undefined8 *)(local_478->data)._M_elems;
          local_4f8.data._M_elems._8_8_ = *(undefined8 *)((local_478->data)._M_elems + 2);
          local_4f8.data._M_elems._16_8_ = *(undefined8 *)((local_478->data)._M_elems + 4);
          local_4f8.data._M_elems._24_8_ = *(undefined8 *)((local_478->data)._M_elems + 6);
          local_4f8.data._M_elems._32_8_ = *(undefined8 *)((local_478->data)._M_elems + 8);
          local_4f8.data._M_elems._40_8_ = *(undefined8 *)((local_478->data)._M_elems + 10);
          local_4f8.data._M_elems._48_8_ = *(undefined8 *)((local_478->data)._M_elems + 0xc);
          uVar6 = *(undefined8 *)((local_478->data)._M_elems + 0xe);
          local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
          local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_4f8.exp = local_478->exp;
          local_4f8.neg = local_478->neg;
          local_4f8.fpclass = local_478->fpclass;
          local_4f8.prec_elem = local_478->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_4f8,local_4a0);
      }
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      (enterMax->m_backend).exp = local_4f8.exp;
      (enterMax->m_backend).neg = local_4f8.neg;
      (enterMax->m_backend).fpclass = local_4f8.fpclass;
      (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
      pnVar5 = (local_498->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend + 8);
      uVar10 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x10);
      uVar11 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x18);
      uVar12 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x20);
      uVar13 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x28);
      uVar14 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x38);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xc) =
           *(undefined8 *)((long)(pnVar5 + local_500) + 0x30);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + local_500) + 0x40);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + local_500) + 0x44);
      uVar6 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x48);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (local_498->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      iVar17 = pnVar5[local_500].m_backend.exp;
      (enterRO->m_backend).exp = iVar17;
      bVar16 = pnVar5[local_500].m_backend.neg;
      (enterRO->m_backend).neg = bVar16;
      fVar2 = pnVar5[local_500].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      pcVar24 = &enterRO->m_backend;
      if ((&local_4f8 != pcVar20) && (pcVar24 = pcVar20, &local_4f8 != &enterRO->m_backend)) {
        local_4f8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_4f8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_4f8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        local_4f8.data._M_elems._24_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_4f8.data._M_elems._32_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_4f8.data._M_elems._40_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 10);
        local_4f8.data._M_elems._48_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe);
        local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
        local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_4f8.prec_elem = iVar3;
        local_4f8.fpclass = fVar2;
        local_4f8.exp = iVar17;
        local_4f8.neg = bVar16;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_4f8,pcVar24);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                ((cpp_dec_float<100U,_int,_void> *)objChange,&local_4f8);
      ::soplex::infinity::__tls_init();
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_4f8,*(double *)(in_FS_OFFSET + -8));
      pcVar20 = local_478;
      local_2b8.m_backend.fpclass = local_478->fpclass;
      if ((local_2b8.m_backend.fpclass != cpp_dec_float_NaN) &&
         (local_4f8.fpclass != cpp_dec_float_NaN)) {
        iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (local_478,&local_4f8);
        if (-1 < iVar17) {
          pSVar21 = (local_498->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data;
          goto LAB_003a1c91;
        }
        local_2b8.m_backend.fpclass = pcVar20->fpclass;
      }
      pSVar25 = local_498;
      local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_4a0->data)._M_elems;
      local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 2);
      local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 4);
      local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 6);
      local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 8);
      local_268.m_backend.data._M_elems._40_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 10);
      local_268.m_backend.data._M_elems._48_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 0xc);
      local_268.m_backend.data._M_elems._56_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 0xe);
      pnVar27 = &local_268;
      local_268.m_backend.exp = local_4a0->exp;
      local_268.m_backend.neg = local_4a0->neg;
      local_268.m_backend.fpclass = local_4a0->fpclass;
      local_268.m_backend.prec_elem = local_4a0->prec_elem;
      local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
      local_2b8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
      local_2b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
      local_2b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
      local_2b8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
      local_2b8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
      local_2b8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
      local_2b8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
      pnVar28 = &local_2b8;
      local_2b8.m_backend.exp = pcVar20->exp;
      local_2b8.m_backend.neg = pcVar20->neg;
      local_2b8.m_backend.prec_elem = pcVar20->prec_elem;
      RVar8 = Tolerances::epsilon((local_498->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      uVar29 = SUB84(RVar8,0);
      uVar31 = (undefined4)((ulong)RVar8 >> 0x20);
      pcVar23 = local_308;
      break;
    case P_FREE:
      puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_4f8.data._M_elems._0_8_ = local_4f8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4f8,"XENTER02 This should never happen.","");
      *puVar22 = &PTR__SPxException_0069d438;
      puVar22[1] = puVar22 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar22 + 1),local_4f8.data._M_elems._0_8_,
                 local_4f8.data._M_elems._0_8_ + local_4f8.data._M_elems._8_8_);
      *puVar22 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar22,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    *(undefined8 *)(pcVar23 + 0x48) = 0x1000000000;
    *(undefined8 *)pcVar23 = 0;
    *(undefined8 *)(pcVar23 + 8) = 0;
    *(undefined8 *)(pcVar23 + 0x10) = 0;
    *(undefined8 *)(pcVar23 + 0x18) = 0;
    *(undefined8 *)(pcVar23 + 0x20) = 0;
    *(undefined8 *)(pcVar23 + 0x28) = 0;
    *(undefined8 *)(pcVar23 + 0x30) = 0;
    *(undefined8 *)(pcVar23 + 0x38) = 0;
    *(undefined8 *)(pcVar23 + 0x3d) = 0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              (pcVar23,(double)CONCAT44(uVar31,uVar29));
    bVar16 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (pnVar27,pnVar28,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)pcVar23);
    pSVar21 = (pSVar25->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data;
    goto LAB_003a201c;
  }
  SPxColId::SPxColId((SPxColId *)&local_4f8,(SPxId *)&local_450);
  iVar17 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
           ::number(&(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set,(DataKey *)&local_4f8);
  local_500 = (long)iVar17;
  *enterStat = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.colstat.data[local_500];
  if (this->theRep == COLUMN) {
    computePvec((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_4f8,this,iVar17);
    computeTest((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_4f8,this,iVar17);
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
    *(ulong *)((enterTest->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
    *(undefined8 *)(enterTest->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
    (enterTest->m_backend).exp = local_4f8.exp;
    (enterTest->m_backend).neg = local_4f8.neg;
    (enterTest->m_backend).fpclass = local_4f8.fpclass;
    (enterTest->m_backend).prec_elem = local_4f8.prec_elem;
    pVVar19 = &this->theTest;
  }
  else {
    pVVar19 = &this->theCoTest;
    pnVar5 = (this->theCoTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar12 = *(undefined8 *)puVar1;
    uVar13 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 0xe) = uVar14;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 8) = uVar12;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 10) = uVar13;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) = uVar10;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 6) = uVar11;
    *(undefined8 *)(enterTest->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) = uVar9;
    (enterTest->m_backend).exp = pnVar5[local_500].m_backend.exp;
    (enterTest->m_backend).neg = pnVar5[local_500].m_backend.neg;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    (enterTest->m_backend).fpclass = pnVar5[local_500].m_backend.fpclass;
    (enterTest->m_backend).prec_elem = iVar3;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(pVVar19->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_500].m_backend,0);
  pcVar20 = local_480;
  pSVar25 = local_498;
  switch(*enterStat) {
  case D_FREE:
    ::soplex::infinity::__tls_init();
    local_468 = *(double *)(in_FS_OFFSET + -8);
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    uStack_460 = 0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_4f8,local_468);
    pSVar25 = local_498;
    *(undefined8 *)(local_478->data)._M_elems = local_4f8.data._M_elems._0_8_;
    *(undefined8 *)((local_478->data)._M_elems + 2) = local_4f8.data._M_elems._8_8_;
    *(undefined8 *)((local_478->data)._M_elems + 4) = local_4f8.data._M_elems._16_8_;
    *(undefined8 *)((local_478->data)._M_elems + 6) = local_4f8.data._M_elems._24_8_;
    *(undefined8 *)((local_478->data)._M_elems + 8) = local_4f8.data._M_elems._32_8_;
    *(undefined8 *)((local_478->data)._M_elems + 10) = local_4f8.data._M_elems._40_8_;
    *(undefined8 *)((local_478->data)._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
    *(ulong *)((local_478->data)._M_elems + 0xe) =
         CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
    local_478->exp = local_4f8.exp;
    local_478->neg = local_4f8.neg;
    local_478->fpclass = local_4f8.fpclass;
    local_478->prec_elem = local_4f8.prec_elem;
    ::soplex::infinity::__tls_init();
    uStack_46c = uStack_460._4_4_ ^ 0x80000000;
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    local_478 = (cpp_dec_float<100U,_int,_void> *)-local_468;
    uStack_470 = (undefined4)uStack_460;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_4f8,-local_468);
    *(undefined8 *)(local_4a0->data)._M_elems = local_4f8.data._M_elems._0_8_;
    *(undefined8 *)((local_4a0->data)._M_elems + 2) = local_4f8.data._M_elems._8_8_;
    *(undefined8 *)((local_4a0->data)._M_elems + 4) = local_4f8.data._M_elems._16_8_;
    *(undefined8 *)((local_4a0->data)._M_elems + 6) = local_4f8.data._M_elems._24_8_;
    *(undefined8 *)((local_4a0->data)._M_elems + 8) = local_4f8.data._M_elems._32_8_;
    *(undefined8 *)((local_4a0->data)._M_elems + 10) = local_4f8.data._M_elems._40_8_;
    *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
    *(ulong *)((local_4a0->data)._M_elems + 0xe) =
         CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
    local_4a0->exp = local_4f8.exp;
    local_4a0->neg = local_4f8.neg;
    local_4a0->fpclass = local_4f8.fpclass;
    local_4a0->prec_elem = local_4f8.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(local_480,0);
    pnVar5 = (pSVar25->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar9 = *(undefined8 *)puVar1;
    uVar10 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar11 = *(undefined8 *)puVar1;
    uVar12 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar13 = *(undefined8 *)puVar1;
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)(enterRO->m_backend).data._M_elems =
         *(undefined8 *)&pnVar5[local_500].m_backend.data;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar6;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar9;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar11;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar12;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = uVar13;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
    (enterRO->m_backend).exp = pnVar5[local_500].m_backend.exp;
    (enterRO->m_backend).neg = pnVar5[local_500].m_backend.neg;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    (enterRO->m_backend).fpclass = pnVar5[local_500].m_backend.fpclass;
    (enterRO->m_backend).prec_elem = iVar3;
    pnVar5 = (pSVar25->theCoPvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x10);
    uVar11 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x18);
    uVar12 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x20);
    uVar13 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x28);
    uVar14 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x38);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xc) =
         *(undefined8 *)((long)(pnVar5 + local_500) + 0x30);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xe) = uVar14;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) = uVar12;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 10) = uVar13;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) = uVar10;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar11;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + local_500) + 0x40);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + local_500) + 0x44);
    uVar6 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x48);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    if ((((int)uVar6 == 2) || ((enterRO->m_backend).fpclass == cpp_dec_float_NaN)) ||
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&enterPric->m_backend,&enterRO->m_backend), iVar17 < 1)) {
      ::soplex::infinity::__tls_init();
      uVar29 = (undefined4)local_478;
      uVar31 = local_478._4_4_;
    }
    else {
      ::soplex::infinity::__tls_init();
      uVar29 = (undefined4)local_468;
      uVar31 = local_468._4_4_;
    }
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.neg = false;
    local_4f8.exp = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_4f8,(double)CONCAT44(uVar31,uVar29));
    *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
    *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
    (enterMax->m_backend).exp = local_4f8.exp;
    (enterMax->m_backend).neg = local_4f8.neg;
    (enterMax->m_backend).fpclass = local_4f8.fpclass;
    (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
    pSVar21 = (pSVar25->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
LAB_003a0f18:
    pSVar21[local_500] = P_FIXED;
    return;
  case D_ON_UPPER:
    pnVar5 = (local_498->theUCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar12 = *(undefined8 *)puVar1;
    uVar13 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((local_478->data)._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((local_478->data)._M_elems + 0xe) = uVar14;
    *(undefined8 *)((local_478->data)._M_elems + 8) = uVar12;
    *(undefined8 *)((local_478->data)._M_elems + 10) = uVar13;
    *(undefined8 *)((local_478->data)._M_elems + 4) = uVar10;
    *(undefined8 *)((local_478->data)._M_elems + 6) = uVar11;
    *(undefined8 *)(local_478->data)._M_elems = uVar6;
    *(undefined8 *)((local_478->data)._M_elems + 2) = uVar9;
    local_478->exp = pnVar5[local_500].m_backend.exp;
    local_478->neg = pnVar5[local_500].m_backend.neg;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    local_478->fpclass = pnVar5[local_500].m_backend.fpclass;
    local_478->prec_elem = iVar3;
    ::soplex::infinity::__tls_init();
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    local_468 = -*(double *)(in_FS_OFFSET + -8);
    uStack_460 = 0x8000000000000000;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_4f8,-*(double *)(in_FS_OFFSET + -8));
    *(undefined8 *)(local_4a0->data)._M_elems = local_4f8.data._M_elems._0_8_;
    *(undefined8 *)((local_4a0->data)._M_elems + 2) = local_4f8.data._M_elems._8_8_;
    *(undefined8 *)((local_4a0->data)._M_elems + 4) = local_4f8.data._M_elems._16_8_;
    *(undefined8 *)((local_4a0->data)._M_elems + 6) = local_4f8.data._M_elems._24_8_;
    *(undefined8 *)((local_4a0->data)._M_elems + 8) = local_4f8.data._M_elems._32_8_;
    *(undefined8 *)((local_4a0->data)._M_elems + 10) = local_4f8.data._M_elems._40_8_;
    *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
    *(ulong *)((local_4a0->data)._M_elems + 0xe) =
         CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
    local_4a0->exp = local_4f8.exp;
    local_4a0->neg = local_4f8.neg;
    local_4a0->fpclass = local_4f8.fpclass;
    local_4a0->prec_elem = local_4f8.prec_elem;
    ::soplex::infinity::__tls_init();
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_4f8,local_468);
    pSVar25 = local_498;
    *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
    *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
    (enterMax->m_backend).exp = local_4f8.exp;
    (enterMax->m_backend).neg = local_4f8.neg;
    (enterMax->m_backend).fpclass = local_4f8.fpclass;
    (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
    uVar6 = *(undefined8 *)(local_478->data)._M_elems;
    uVar9 = *(undefined8 *)((local_478->data)._M_elems + 2);
    uVar10 = *(undefined8 *)((local_478->data)._M_elems + 4);
    uVar11 = *(undefined8 *)((local_478->data)._M_elems + 6);
    uVar12 = *(undefined8 *)((local_478->data)._M_elems + 8);
    uVar13 = *(undefined8 *)((local_478->data)._M_elems + 10);
    uVar14 = *(undefined8 *)((local_478->data)._M_elems + 0xe);
    *(undefined8 *)((local_480->data)._M_elems + 0xc) =
         *(undefined8 *)((local_478->data)._M_elems + 0xc);
    *(undefined8 *)((local_480->data)._M_elems + 0xe) = uVar14;
    *(undefined8 *)((local_480->data)._M_elems + 8) = uVar12;
    *(undefined8 *)((local_480->data)._M_elems + 10) = uVar13;
    *(undefined8 *)((local_480->data)._M_elems + 4) = uVar10;
    *(undefined8 *)((local_480->data)._M_elems + 6) = uVar11;
    *(undefined8 *)(local_480->data)._M_elems = uVar6;
    *(undefined8 *)((local_480->data)._M_elems + 2) = uVar9;
    local_480->exp = local_478->exp;
    local_480->neg = local_478->neg;
    iVar3 = local_478->prec_elem;
    local_480->fpclass = local_478->fpclass;
    local_480->prec_elem = iVar3;
    pnVar5 = (local_498->theCoPvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x10);
    uVar11 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x18);
    uVar12 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x20);
    uVar13 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x28);
    uVar14 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x38);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xc) =
         *(undefined8 *)((long)(pnVar5 + local_500) + 0x30);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xe) = uVar14;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) = uVar12;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 10) = uVar13;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) = uVar10;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar11;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + local_500) + 0x40);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + local_500) + 0x44);
    uVar6 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x48);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    pnVar5 = (local_498->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar12 = *(undefined8 *)puVar1;
    uVar13 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar12;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar13;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar10;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar11;
    *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
    iVar17 = pnVar5[local_500].m_backend.exp;
    (enterRO->m_backend).exp = iVar17;
    bVar16 = pnVar5[local_500].m_backend.neg;
    (enterRO->m_backend).neg = bVar16;
    fVar2 = pnVar5[local_500].m_backend.fpclass;
    (enterRO->m_backend).fpclass = fVar2;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    (enterRO->m_backend).prec_elem = iVar3;
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    pcVar20 = &enterRO->m_backend;
    if ((&local_4f8 != local_480) && (pcVar20 = local_480, &local_4f8 != &enterRO->m_backend)) {
      local_4f8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
      local_4f8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
      local_4f8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
      local_4f8.data._M_elems._24_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
      local_4f8.data._M_elems._32_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
      local_4f8.data._M_elems._40_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 10);
      local_4f8.data._M_elems._48_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc);
      uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe);
      local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
      local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_4f8.prec_elem = iVar3;
      local_4f8.fpclass = fVar2;
      local_4f8.exp = iVar17;
      local_4f8.neg = bVar16;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_4f8,pcVar20);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              ((cpp_dec_float<100U,_int,_void> *)objChange,&local_4f8);
    pSVar21 = (pSVar25->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
LAB_003a14f7:
    pSVar21[local_500] = P_ON_LOWER;
    return;
  case D_ON_LOWER:
    pnVar5 = (local_498->theLCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar12 = *(undefined8 *)puVar1;
    uVar13 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((local_4a0->data)._M_elems + 0xe) = uVar14;
    *(undefined8 *)((local_4a0->data)._M_elems + 8) = uVar12;
    *(undefined8 *)((local_4a0->data)._M_elems + 10) = uVar13;
    *(undefined8 *)((local_4a0->data)._M_elems + 4) = uVar10;
    *(undefined8 *)((local_4a0->data)._M_elems + 6) = uVar11;
    *(undefined8 *)(local_4a0->data)._M_elems = uVar6;
    *(undefined8 *)((local_4a0->data)._M_elems + 2) = uVar9;
    local_4a0->exp = pnVar5[local_500].m_backend.exp;
    local_4a0->neg = pnVar5[local_500].m_backend.neg;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    local_4a0->fpclass = pnVar5[local_500].m_backend.fpclass;
    local_4a0->prec_elem = iVar3;
    ::soplex::infinity::__tls_init();
    local_468 = *(double *)(in_FS_OFFSET + -8);
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_4f8,local_468);
    *(undefined8 *)(local_478->data)._M_elems = local_4f8.data._M_elems._0_8_;
    *(undefined8 *)((local_478->data)._M_elems + 2) = local_4f8.data._M_elems._8_8_;
    *(undefined8 *)((local_478->data)._M_elems + 4) = local_4f8.data._M_elems._16_8_;
    *(undefined8 *)((local_478->data)._M_elems + 6) = local_4f8.data._M_elems._24_8_;
    *(undefined8 *)((local_478->data)._M_elems + 8) = local_4f8.data._M_elems._32_8_;
    *(undefined8 *)((local_478->data)._M_elems + 10) = local_4f8.data._M_elems._40_8_;
    *(undefined8 *)((local_478->data)._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
    *(ulong *)((local_478->data)._M_elems + 0xe) =
         CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
    local_478->exp = local_4f8.exp;
    local_478->neg = local_4f8.neg;
    local_478->fpclass = local_4f8.fpclass;
    local_478->prec_elem = local_4f8.prec_elem;
    ::soplex::infinity::__tls_init();
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_4f8,local_468);
    pSVar25 = local_498;
    *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
    *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
    (enterMax->m_backend).exp = local_4f8.exp;
    (enterMax->m_backend).neg = local_4f8.neg;
    (enterMax->m_backend).fpclass = local_4f8.fpclass;
    (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
    uVar6 = *(undefined8 *)(local_4a0->data)._M_elems;
    uVar9 = *(undefined8 *)((local_4a0->data)._M_elems + 2);
    uVar10 = *(undefined8 *)((local_4a0->data)._M_elems + 4);
    uVar11 = *(undefined8 *)((local_4a0->data)._M_elems + 6);
    uVar12 = *(undefined8 *)((local_4a0->data)._M_elems + 8);
    uVar13 = *(undefined8 *)((local_4a0->data)._M_elems + 10);
    uVar14 = *(undefined8 *)((local_4a0->data)._M_elems + 0xe);
    *(undefined8 *)((local_480->data)._M_elems + 0xc) =
         *(undefined8 *)((local_4a0->data)._M_elems + 0xc);
    *(undefined8 *)((local_480->data)._M_elems + 0xe) = uVar14;
    *(undefined8 *)((local_480->data)._M_elems + 8) = uVar12;
    *(undefined8 *)((local_480->data)._M_elems + 10) = uVar13;
    *(undefined8 *)((local_480->data)._M_elems + 4) = uVar10;
    *(undefined8 *)((local_480->data)._M_elems + 6) = uVar11;
    *(undefined8 *)(local_480->data)._M_elems = uVar6;
    *(undefined8 *)((local_480->data)._M_elems + 2) = uVar9;
    local_480->exp = local_4a0->exp;
    local_480->neg = local_4a0->neg;
    iVar3 = local_4a0->prec_elem;
    local_480->fpclass = local_4a0->fpclass;
    local_480->prec_elem = iVar3;
    pnVar5 = (local_498->theCoPvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x10);
    uVar11 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x18);
    uVar12 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x20);
    uVar13 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x28);
    uVar14 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x38);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xc) =
         *(undefined8 *)((long)(pnVar5 + local_500) + 0x30);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xe) = uVar14;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) = uVar12;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 10) = uVar13;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) = uVar10;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar11;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + local_500) + 0x40);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + local_500) + 0x44);
    uVar6 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x48);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    pnVar5 = (local_498->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar12 = *(undefined8 *)puVar1;
    uVar13 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar12;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar13;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar10;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar11;
    *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
    iVar17 = pnVar5[local_500].m_backend.exp;
    (enterRO->m_backend).exp = iVar17;
    bVar16 = pnVar5[local_500].m_backend.neg;
    (enterRO->m_backend).neg = bVar16;
    fVar2 = pnVar5[local_500].m_backend.fpclass;
    (enterRO->m_backend).fpclass = fVar2;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    (enterRO->m_backend).prec_elem = iVar3;
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    pcVar20 = &enterRO->m_backend;
    if ((&local_4f8 != local_480) && (pcVar20 = local_480, &local_4f8 != &enterRO->m_backend)) {
      local_4f8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
      local_4f8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
      local_4f8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
      local_4f8.data._M_elems._24_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
      local_4f8.data._M_elems._32_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
      local_4f8.data._M_elems._40_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 10);
      local_4f8.data._M_elems._48_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc);
      uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe);
      local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
      local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_4f8.prec_elem = iVar3;
      local_4f8.fpclass = fVar2;
      local_4f8.exp = iVar17;
      local_4f8.neg = bVar16;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_4f8,pcVar20);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              ((cpp_dec_float<100U,_int,_void> *)objChange,&local_4f8);
    pSVar21 = (pSVar25->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
LAB_003a1402:
    pSVar21[local_500] = P_ON_UPPER;
    return;
  case D_ON_BOTH:
    pnVar5 = (local_498->theCoPvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x10);
    uVar11 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x18);
    uVar12 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x20);
    uVar13 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x28);
    uVar14 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x38);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xc) =
         *(undefined8 *)((long)(pnVar5 + local_500) + 0x30);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xe) = uVar14;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) = uVar12;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 10) = uVar13;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) = uVar10;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar11;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + local_500) + 0x40);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + local_500) + 0x44);
    uVar6 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x48);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    if ((((int)uVar6 == 2) ||
        (pnVar5 = (local_498->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        pnVar5[local_500].m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&enterPric->m_backend,&pnVar5[local_500].m_backend), iVar17 < 1)) {
      pnVar5 = (pSVar25->theUCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)puVar1;
      uVar15 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_478->data)._M_elems + 0xc) = uVar14;
      *(undefined8 *)((local_478->data)._M_elems + 0xe) = uVar15;
      *(undefined8 *)((local_478->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((local_478->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((local_478->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((local_478->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(local_478->data)._M_elems = uVar6;
      *(undefined8 *)((local_478->data)._M_elems + 2) = uVar9;
      local_478->exp = pnVar5[local_500].m_backend.exp;
      local_478->neg = pnVar5[local_500].m_backend.neg;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      local_478->fpclass = pnVar5[local_500].m_backend.fpclass;
      local_478->prec_elem = iVar3;
      *(undefined8 *)((pcVar20->data)._M_elems + 0xc) = uVar14;
      *(undefined8 *)((pcVar20->data)._M_elems + 0xe) = uVar15;
      *(undefined8 *)((pcVar20->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((pcVar20->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((pcVar20->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((pcVar20->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(pcVar20->data)._M_elems = uVar6;
      *(undefined8 *)((pcVar20->data)._M_elems + 2) = uVar9;
      pcVar20->exp = local_478->exp;
      pcVar20->neg = local_478->neg;
      iVar3 = local_478->prec_elem;
      pcVar20->fpclass = local_478->fpclass;
      pcVar20->prec_elem = iVar3;
      pnVar5 = (pSVar25->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      (enterRO->m_backend).exp = pnVar5[local_500].m_backend.exp;
      (enterRO->m_backend).neg = pnVar5[local_500].m_backend.neg;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      (enterRO->m_backend).fpclass = pnVar5[local_500].m_backend.fpclass;
      (enterRO->m_backend).prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      local_478 = (cpp_dec_float<100U,_int,_void> *)
                  ((ulong)*(double *)(in_FS_OFFSET + -8) ^ 0x8000000000000000);
      uStack_470 = 0;
      uStack_46c = 0x80000000;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_4f8,-*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(local_4a0->data)._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((local_4a0->data)._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      local_4a0->exp = local_4f8.exp;
      local_4a0->neg = local_4f8.neg;
      local_4a0->fpclass = local_4f8.fpclass;
      local_4a0->prec_elem = local_4f8.prec_elem;
      ::soplex::infinity::__tls_init();
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_4f8,(double)local_478);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      (enterMax->m_backend).exp = local_4f8.exp;
      (enterMax->m_backend).neg = local_4f8.neg;
      (enterMax->m_backend).fpclass = local_4f8.fpclass;
      (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
      SVar18 = P_ON_LOWER;
    }
    else {
      pnVar5 = (pSVar25->theLCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_4a0->data)._M_elems + 0xe) = uVar14;
      *(undefined8 *)((local_4a0->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((local_4a0->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((local_4a0->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((local_4a0->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(local_4a0->data)._M_elems = uVar6;
      *(undefined8 *)((local_4a0->data)._M_elems + 2) = uVar9;
      local_4a0->exp = pnVar5[local_500].m_backend.exp;
      local_4a0->neg = pnVar5[local_500].m_backend.neg;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      local_4a0->fpclass = pnVar5[local_500].m_backend.fpclass;
      local_4a0->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_468 = *(double *)(in_FS_OFFSET + -8);
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_4f8,local_468);
      *(undefined8 *)(local_478->data)._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((local_478->data)._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      *(undefined8 *)((local_478->data)._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((local_478->data)._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)((local_478->data)._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((local_478->data)._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((local_478->data)._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((local_478->data)._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      local_478->exp = local_4f8.exp;
      local_478->neg = local_4f8.neg;
      local_478->fpclass = local_4f8.fpclass;
      local_478->prec_elem = local_4f8.prec_elem;
      ::soplex::infinity::__tls_init();
      local_4f8.fpclass = cpp_dec_float_finite;
      local_4f8.prec_elem = 0x10;
      local_4f8.data._M_elems[0] = 0;
      local_4f8.data._M_elems[1] = 0;
      local_4f8.data._M_elems[2] = 0;
      local_4f8.data._M_elems[3] = 0;
      local_4f8.data._M_elems[4] = 0;
      local_4f8.data._M_elems[5] = 0;
      local_4f8.data._M_elems[6] = 0;
      local_4f8.data._M_elems[7] = 0;
      local_4f8.data._M_elems[8] = 0;
      local_4f8.data._M_elems[9] = 0;
      local_4f8.data._M_elems[10] = 0;
      local_4f8.data._M_elems[0xb] = 0;
      local_4f8.data._M_elems[0xc] = 0;
      local_4f8.data._M_elems[0xd] = 0;
      local_4f8.data._M_elems._56_5_ = 0;
      local_4f8.data._M_elems[0xf]._1_3_ = 0;
      local_4f8.exp = 0;
      local_4f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_4f8,local_468);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
      (enterMax->m_backend).exp = local_4f8.exp;
      (enterMax->m_backend).neg = local_4f8.neg;
      (enterMax->m_backend).fpclass = local_4f8.fpclass;
      (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
      uVar6 = *(undefined8 *)(local_4a0->data)._M_elems;
      uVar9 = *(undefined8 *)((local_4a0->data)._M_elems + 2);
      uVar10 = *(undefined8 *)((local_4a0->data)._M_elems + 4);
      uVar11 = *(undefined8 *)((local_4a0->data)._M_elems + 6);
      uVar12 = *(undefined8 *)((local_4a0->data)._M_elems + 8);
      uVar13 = *(undefined8 *)((local_4a0->data)._M_elems + 10);
      uVar14 = *(undefined8 *)((local_4a0->data)._M_elems + 0xe);
      *(undefined8 *)((local_480->data)._M_elems + 0xc) =
           *(undefined8 *)((local_4a0->data)._M_elems + 0xc);
      *(undefined8 *)((local_480->data)._M_elems + 0xe) = uVar14;
      *(undefined8 *)((local_480->data)._M_elems + 8) = uVar12;
      *(undefined8 *)((local_480->data)._M_elems + 10) = uVar13;
      *(undefined8 *)((local_480->data)._M_elems + 4) = uVar10;
      *(undefined8 *)((local_480->data)._M_elems + 6) = uVar11;
      *(undefined8 *)(local_480->data)._M_elems = uVar6;
      *(undefined8 *)((local_480->data)._M_elems + 2) = uVar9;
      local_480->exp = local_4a0->exp;
      local_480->neg = local_4a0->neg;
      iVar3 = local_4a0->prec_elem;
      local_480->fpclass = local_4a0->fpclass;
      local_480->prec_elem = iVar3;
      pnVar5 = (local_498->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
      uVar12 = *(undefined8 *)puVar1;
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
      uVar14 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar12;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar13;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar10;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar11;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      (enterRO->m_backend).exp = pnVar5[local_500].m_backend.exp;
      (enterRO->m_backend).neg = pnVar5[local_500].m_backend.neg;
      iVar3 = pnVar5[local_500].m_backend.prec_elem;
      (enterRO->m_backend).fpclass = pnVar5[local_500].m_backend.fpclass;
      (enterRO->m_backend).prec_elem = iVar3;
      SVar18 = P_ON_UPPER;
      pSVar25 = local_498;
    }
    (pSVar25->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.colstat.data[local_500] = SVar18;
    pcVar24 = &(pSVar25->theLCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_500].m_backend;
    pcVar26 = &(pSVar25->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_500].m_backend;
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    pcVar20 = pcVar24;
    if ((&local_4f8 != pcVar26) && (pcVar20 = pcVar26, &local_4f8 != pcVar24)) {
      local_4f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar24->data)._M_elems;
      local_4f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 2);
      local_4f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 4);
      local_4f8.data._M_elems._24_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 6);
      local_4f8.data._M_elems._32_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 8);
      local_4f8.data._M_elems._40_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 10);
      local_4f8.data._M_elems._48_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 0xc);
      uVar6 = *(undefined8 *)((pcVar24->data)._M_elems + 0xe);
      local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
      local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_4f8.exp = pcVar24->exp;
      local_4f8.neg = pcVar24->neg;
      local_4f8.fpclass = pcVar24->fpclass;
      local_4f8.prec_elem = pcVar24->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_4f8,pcVar20);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              ((cpp_dec_float<100U,_int,_void> *)objChange,&local_4f8);
    pcVar20 = &(pSVar25->theUCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_500].m_backend;
    pcVar24 = &(pSVar25->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_500].m_backend;
LAB_003a144d:
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    pcVar26 = pcVar20;
    if ((&local_4f8 != pcVar24) && (pcVar26 = pcVar24, &local_4f8 != pcVar20)) {
      local_4f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
      local_4f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
      local_4f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
      local_4f8.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
      local_4f8.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
      local_4f8.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
      local_4f8.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
      uVar6 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
      local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
      local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_4f8.exp = pcVar20->exp;
      local_4f8.neg = pcVar20->neg;
      local_4f8.fpclass = pcVar20->fpclass;
      local_4f8.prec_elem = pcVar20->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_4f8,pcVar26);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              ((cpp_dec_float<100U,_int,_void> *)objChange,&local_4f8);
    return;
  case P_ON_LOWER:
    pnVar5 = (local_498->theUCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar12 = *(undefined8 *)puVar1;
    uVar13 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((local_478->data)._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((local_478->data)._M_elems + 0xe) = uVar14;
    *(undefined8 *)((local_478->data)._M_elems + 8) = uVar12;
    *(undefined8 *)((local_478->data)._M_elems + 10) = uVar13;
    *(undefined8 *)((local_478->data)._M_elems + 4) = uVar10;
    *(undefined8 *)((local_478->data)._M_elems + 6) = uVar11;
    *(undefined8 *)(local_478->data)._M_elems = uVar6;
    *(undefined8 *)((local_478->data)._M_elems + 2) = uVar9;
    local_478->exp = pnVar5[local_500].m_backend.exp;
    local_478->neg = pnVar5[local_500].m_backend.neg;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    local_478->fpclass = pnVar5[local_500].m_backend.fpclass;
    local_478->prec_elem = iVar3;
    pnVar5 = (local_498->theLCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar12 = *(undefined8 *)puVar1;
    uVar13 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar14 = *(undefined8 *)puVar1;
    uVar15 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = uVar14;
    *(undefined8 *)((local_4a0->data)._M_elems + 0xe) = uVar15;
    *(undefined8 *)((local_4a0->data)._M_elems + 8) = uVar12;
    *(undefined8 *)((local_4a0->data)._M_elems + 10) = uVar13;
    *(undefined8 *)((local_4a0->data)._M_elems + 4) = uVar10;
    *(undefined8 *)((local_4a0->data)._M_elems + 6) = uVar11;
    *(undefined8 *)(local_4a0->data)._M_elems = uVar6;
    *(undefined8 *)((local_4a0->data)._M_elems + 2) = uVar9;
    local_4a0->exp = pnVar5[local_500].m_backend.exp;
    local_4a0->neg = pnVar5[local_500].m_backend.neg;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    local_4a0->fpclass = pnVar5[local_500].m_backend.fpclass;
    local_4a0->prec_elem = iVar3;
    *(undefined8 *)((local_480->data)._M_elems + 0xc) = uVar14;
    *(undefined8 *)((local_480->data)._M_elems + 0xe) = uVar15;
    *(undefined8 *)((local_480->data)._M_elems + 8) = uVar12;
    *(undefined8 *)((local_480->data)._M_elems + 10) = uVar13;
    *(undefined8 *)((local_480->data)._M_elems + 4) = uVar10;
    *(undefined8 *)((local_480->data)._M_elems + 6) = uVar11;
    *(undefined8 *)(local_480->data)._M_elems = uVar6;
    *(undefined8 *)((local_480->data)._M_elems + 2) = uVar9;
    local_480->exp = local_4a0->exp;
    local_480->neg = local_4a0->neg;
    iVar3 = local_4a0->prec_elem;
    pcVar20->fpclass = local_4a0->fpclass;
    pcVar20->prec_elem = iVar3;
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    if (&local_4f8 == local_4a0) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                (&local_4f8,local_478);
      if (local_4f8.data._M_elems[0] != 0 || local_4f8.fpclass != cpp_dec_float_finite) {
        local_4f8.neg = (bool)(local_4f8.neg ^ 1);
      }
    }
    else {
      if (&local_4f8 != local_478) {
        local_4f8.data._M_elems._0_8_ = *(undefined8 *)(local_478->data)._M_elems;
        local_4f8.data._M_elems._8_8_ = *(undefined8 *)((local_478->data)._M_elems + 2);
        local_4f8.data._M_elems._16_8_ = *(undefined8 *)((local_478->data)._M_elems + 4);
        local_4f8.data._M_elems._24_8_ = *(undefined8 *)((local_478->data)._M_elems + 6);
        local_4f8.data._M_elems._32_8_ = *(undefined8 *)((local_478->data)._M_elems + 8);
        local_4f8.data._M_elems._40_8_ = *(undefined8 *)((local_478->data)._M_elems + 10);
        local_4f8.data._M_elems._48_8_ = *(undefined8 *)((local_478->data)._M_elems + 0xc);
        uVar6 = *(undefined8 *)((local_478->data)._M_elems + 0xe);
        local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
        local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_4f8.exp = local_478->exp;
        local_4f8.neg = local_478->neg;
        local_4f8.fpclass = local_478->fpclass;
        local_4f8.prec_elem = local_478->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                (&local_4f8,local_4a0);
    }
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
    *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
    *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
    (enterMax->m_backend).exp = local_4f8.exp;
    (enterMax->m_backend).neg = local_4f8.neg;
    (enterMax->m_backend).fpclass = local_4f8.fpclass;
    (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
    pnVar5 = (local_498->thePvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x10);
    uVar11 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x18);
    uVar12 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x20);
    uVar13 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x28);
    uVar14 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x38);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xc) =
         *(undefined8 *)((long)(pnVar5 + local_500) + 0x30);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xe) = uVar14;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) = uVar12;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 10) = uVar13;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) = uVar10;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar11;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + local_500) + 0x40);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + local_500) + 0x44);
    uVar6 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x48);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    pnVar5 = (local_498->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar12 = *(undefined8 *)puVar1;
    uVar13 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar12;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar13;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar10;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar11;
    *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
    (enterRO->m_backend).exp = pnVar5[local_500].m_backend.exp;
    (enterRO->m_backend).neg = pnVar5[local_500].m_backend.neg;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    (enterRO->m_backend).fpclass = pnVar5[local_500].m_backend.fpclass;
    (enterRO->m_backend).prec_elem = iVar3;
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    pcVar24 = pcVar20;
    if ((&local_4f8 != &enterRO->m_backend) &&
       (pcVar24 = &enterRO->m_backend, &local_4f8 != pcVar20)) {
      local_4f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
      local_4f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
      local_4f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
      local_4f8.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
      local_4f8.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
      local_4f8.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
      local_4f8.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
      uVar6 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
      local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
      local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_4f8.exp = pcVar20->exp;
      local_4f8.neg = pcVar20->neg;
      local_4f8.fpclass = pcVar20->fpclass;
      local_4f8.prec_elem = pcVar20->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_4f8,pcVar24);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              ((cpp_dec_float<100U,_int,_void> *)objChange,&local_4f8);
    ::soplex::infinity::__tls_init();
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_4f8,*(double *)(in_FS_OFFSET + -8));
    pcVar20 = local_478;
    local_1c8.m_backend.fpclass = local_478->fpclass;
    if ((local_1c8.m_backend.fpclass != cpp_dec_float_NaN) &&
       (local_4f8.fpclass != cpp_dec_float_NaN)) {
      iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (local_478,&local_4f8);
      if (-1 < iVar17) {
        pSVar21 = (local_498->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data;
LAB_003a2048:
        pSVar21[local_500] = D_ON_UPPER;
        return;
      }
      local_1c8.m_backend.fpclass = pcVar20->fpclass;
    }
    pSVar25 = local_498;
    local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_4a0->data)._M_elems;
    local_178.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 2);
    local_178.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 4);
    local_178.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 6);
    local_178.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 8);
    local_178.m_backend.data._M_elems._40_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 10);
    local_178.m_backend.data._M_elems._48_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 0xc);
    local_178.m_backend.data._M_elems._56_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 0xe);
    pnVar27 = &local_178;
    local_178.m_backend.exp = local_4a0->exp;
    local_178.m_backend.neg = local_4a0->neg;
    local_178.m_backend.fpclass = local_4a0->fpclass;
    local_178.m_backend.prec_elem = local_4a0->prec_elem;
    local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
    local_1c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
    local_1c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
    local_1c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
    local_1c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
    local_1c8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
    local_1c8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
    local_1c8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
    pnVar28 = &local_1c8;
    local_1c8.m_backend.exp = pcVar20->exp;
    local_1c8.m_backend.neg = pcVar20->neg;
    local_1c8.m_backend.prec_elem = pcVar20->prec_elem;
    RVar8 = Tolerances::epsilon((local_498->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    uVar29 = SUB84(RVar8,0);
    uVar31 = (undefined4)((ulong)RVar8 >> 0x20);
    pcVar23 = local_218;
    break;
  default:
    puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_4f8.data._M_elems._0_8_ = local_4f8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4f8,"XENTER01 This should never happen.","");
    *puVar22 = &PTR__SPxException_0069d438;
    puVar22[1] = puVar22 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar22 + 1),local_4f8.data._M_elems._0_8_,
               local_4f8.data._M_elems._0_8_ + local_4f8.data._M_elems._8_8_);
    *puVar22 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar22,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_UPPER:
    pnVar5 = (local_498->theUCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar12 = *(undefined8 *)puVar1;
    uVar13 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((local_478->data)._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((local_478->data)._M_elems + 0xe) = uVar14;
    *(undefined8 *)((local_478->data)._M_elems + 8) = uVar12;
    *(undefined8 *)((local_478->data)._M_elems + 10) = uVar13;
    *(undefined8 *)((local_478->data)._M_elems + 4) = uVar10;
    *(undefined8 *)((local_478->data)._M_elems + 6) = uVar11;
    *(undefined8 *)(local_478->data)._M_elems = uVar6;
    *(undefined8 *)((local_478->data)._M_elems + 2) = uVar9;
    local_478->exp = pnVar5[local_500].m_backend.exp;
    local_478->neg = pnVar5[local_500].m_backend.neg;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    local_478->fpclass = pnVar5[local_500].m_backend.fpclass;
    local_478->prec_elem = iVar3;
    pnVar5 = (local_498->theLCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar12 = *(undefined8 *)puVar1;
    uVar13 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((local_4a0->data)._M_elems + 0xe) = uVar14;
    *(undefined8 *)((local_4a0->data)._M_elems + 8) = uVar12;
    *(undefined8 *)((local_4a0->data)._M_elems + 10) = uVar13;
    *(undefined8 *)((local_4a0->data)._M_elems + 4) = uVar10;
    *(undefined8 *)((local_4a0->data)._M_elems + 6) = uVar11;
    *(undefined8 *)(local_4a0->data)._M_elems = uVar6;
    *(undefined8 *)((local_4a0->data)._M_elems + 2) = uVar9;
    local_4a0->exp = pnVar5[local_500].m_backend.exp;
    local_4a0->neg = pnVar5[local_500].m_backend.neg;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    local_4a0->fpclass = pnVar5[local_500].m_backend.fpclass;
    local_4a0->prec_elem = iVar3;
    uVar6 = *(undefined8 *)(local_478->data)._M_elems;
    uVar9 = *(undefined8 *)((local_478->data)._M_elems + 2);
    uVar10 = *(undefined8 *)((local_478->data)._M_elems + 4);
    uVar11 = *(undefined8 *)((local_478->data)._M_elems + 6);
    uVar12 = *(undefined8 *)((local_478->data)._M_elems + 8);
    uVar13 = *(undefined8 *)((local_478->data)._M_elems + 10);
    uVar14 = *(undefined8 *)((local_478->data)._M_elems + 0xe);
    *(undefined8 *)((local_480->data)._M_elems + 0xc) =
         *(undefined8 *)((local_478->data)._M_elems + 0xc);
    *(undefined8 *)((local_480->data)._M_elems + 0xe) = uVar14;
    *(undefined8 *)((local_480->data)._M_elems + 8) = uVar12;
    *(undefined8 *)((local_480->data)._M_elems + 10) = uVar13;
    *(undefined8 *)((local_480->data)._M_elems + 4) = uVar10;
    *(undefined8 *)((local_480->data)._M_elems + 6) = uVar11;
    *(undefined8 *)(local_480->data)._M_elems = uVar6;
    *(undefined8 *)((local_480->data)._M_elems + 2) = uVar9;
    local_480->exp = local_478->exp;
    local_480->neg = local_478->neg;
    iVar3 = local_478->prec_elem;
    pcVar20->fpclass = local_478->fpclass;
    pcVar20->prec_elem = iVar3;
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    if (&local_4f8 == local_478) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                (&local_4f8,local_4a0);
      if (local_4f8.data._M_elems[0] != 0 || local_4f8.fpclass != cpp_dec_float_finite) {
        local_4f8.neg = (bool)(local_4f8.neg ^ 1);
      }
    }
    else {
      if (&local_4f8 != local_4a0) {
        local_4f8.data._M_elems._0_8_ = *(undefined8 *)(local_4a0->data)._M_elems;
        local_4f8.data._M_elems._8_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 2);
        local_4f8.data._M_elems._16_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 4);
        local_4f8.data._M_elems._24_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 6);
        local_4f8.data._M_elems._32_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 8);
        local_4f8.data._M_elems._40_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 10);
        local_4f8.data._M_elems._48_8_ = *(undefined8 *)((local_4a0->data)._M_elems + 0xc);
        uVar6 = *(undefined8 *)((local_4a0->data)._M_elems + 0xe);
        local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
        local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_4f8.exp = local_4a0->exp;
        local_4f8.neg = local_4a0->neg;
        local_4f8.fpclass = local_4a0->fpclass;
        local_4f8.prec_elem = local_4a0->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                (&local_4f8,local_478);
    }
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
    *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
    *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
    (enterMax->m_backend).exp = local_4f8.exp;
    (enterMax->m_backend).neg = local_4f8.neg;
    (enterMax->m_backend).fpclass = local_4f8.fpclass;
    (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
    pnVar5 = (local_498->thePvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x10);
    uVar11 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x18);
    uVar12 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x20);
    uVar13 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x28);
    uVar14 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x38);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xc) =
         *(undefined8 *)((long)(pnVar5 + local_500) + 0x30);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xe) = uVar14;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) = uVar12;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 10) = uVar13;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) = uVar10;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar11;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + local_500) + 0x40);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + local_500) + 0x44);
    uVar6 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x48);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    pnVar5 = (local_498->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar12 = *(undefined8 *)puVar1;
    uVar13 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar12;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar13;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar10;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar11;
    *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
    (enterRO->m_backend).exp = pnVar5[local_500].m_backend.exp;
    (enterRO->m_backend).neg = pnVar5[local_500].m_backend.neg;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    (enterRO->m_backend).fpclass = pnVar5[local_500].m_backend.fpclass;
    (enterRO->m_backend).prec_elem = iVar3;
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    pcVar24 = pcVar20;
    if ((&local_4f8 != &enterRO->m_backend) &&
       (pcVar24 = &enterRO->m_backend, &local_4f8 != pcVar20)) {
      local_4f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
      local_4f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
      local_4f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
      local_4f8.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
      local_4f8.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
      local_4f8.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
      local_4f8.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
      uVar6 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
      local_4f8.data._M_elems._56_5_ = SUB85(uVar6,0);
      local_4f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_4f8.exp = pcVar20->exp;
      local_4f8.neg = pcVar20->neg;
      local_4f8.fpclass = pcVar20->fpclass;
      local_4f8.prec_elem = pcVar20->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_4f8,pcVar24);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              ((cpp_dec_float<100U,_int,_void> *)objChange,&local_4f8);
    ::soplex::infinity::__tls_init();
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_4f8,-*(double *)(in_FS_OFFSET + -8));
    pcVar20 = local_4a0;
    local_88.m_backend.fpclass = local_4a0->fpclass;
    if ((local_88.m_backend.fpclass != cpp_dec_float_NaN) &&
       (local_4f8.fpclass != cpp_dec_float_NaN)) {
      iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (local_4a0,&local_4f8);
      if (iVar17 < 1) {
        pSVar21 = (local_498->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data;
LAB_003a1c91:
        pSVar21[local_500] = D_ON_LOWER;
        return;
      }
      local_88.m_backend.fpclass = pcVar20->fpclass;
    }
    pSVar25 = local_498;
    local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
    local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
    local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
    local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
    local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
    local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
    local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
    local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
    pnVar27 = &local_88;
    local_88.m_backend.exp = pcVar20->exp;
    local_88.m_backend.neg = pcVar20->neg;
    local_88.m_backend.prec_elem = pcVar20->prec_elem;
    local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_478->data)._M_elems;
    local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_478->data)._M_elems + 2);
    local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_478->data)._M_elems + 4);
    local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_478->data)._M_elems + 6);
    local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_478->data)._M_elems + 8);
    local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((local_478->data)._M_elems + 10);
    local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((local_478->data)._M_elems + 0xc);
    local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((local_478->data)._M_elems + 0xe);
    pnVar28 = &local_d8;
    local_d8.m_backend.exp = local_478->exp;
    local_d8.m_backend.neg = local_478->neg;
    local_d8.m_backend.fpclass = local_478->fpclass;
    local_d8.m_backend.prec_elem = local_478->prec_elem;
    RVar8 = Tolerances::epsilon((local_498->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    uVar29 = SUB84(RVar8,0);
    uVar31 = (undefined4)((ulong)RVar8 >> 0x20);
    pcVar23 = local_128;
    break;
  case P_FREE:
    pnVar5 = (local_498->theUCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar12 = *(undefined8 *)puVar1;
    uVar13 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((local_478->data)._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((local_478->data)._M_elems + 0xe) = uVar14;
    *(undefined8 *)((local_478->data)._M_elems + 8) = uVar12;
    *(undefined8 *)((local_478->data)._M_elems + 10) = uVar13;
    *(undefined8 *)((local_478->data)._M_elems + 4) = uVar10;
    *(undefined8 *)((local_478->data)._M_elems + 6) = uVar11;
    *(undefined8 *)(local_478->data)._M_elems = uVar6;
    *(undefined8 *)((local_478->data)._M_elems + 2) = uVar9;
    local_478->exp = pnVar5[local_500].m_backend.exp;
    local_478->neg = pnVar5[local_500].m_backend.neg;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    local_478->fpclass = pnVar5[local_500].m_backend.fpclass;
    local_478->prec_elem = iVar3;
    pnVar5 = (local_498->theLCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar12 = *(undefined8 *)puVar1;
    uVar13 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((local_4a0->data)._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((local_4a0->data)._M_elems + 0xe) = uVar14;
    *(undefined8 *)((local_4a0->data)._M_elems + 8) = uVar12;
    *(undefined8 *)((local_4a0->data)._M_elems + 10) = uVar13;
    *(undefined8 *)((local_4a0->data)._M_elems + 4) = uVar10;
    *(undefined8 *)((local_4a0->data)._M_elems + 6) = uVar11;
    *(undefined8 *)(local_4a0->data)._M_elems = uVar6;
    *(undefined8 *)((local_4a0->data)._M_elems + 2) = uVar9;
    local_4a0->exp = pnVar5[local_500].m_backend.exp;
    local_4a0->neg = pnVar5[local_500].m_backend.neg;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    local_4a0->fpclass = pnVar5[local_500].m_backend.fpclass;
    local_4a0->prec_elem = iVar3;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(local_480,0);
    pnVar5 = (pSVar25->thePvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)&pnVar5[local_500].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[local_500].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x10);
    uVar11 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x18);
    uVar12 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x20);
    uVar13 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x28);
    uVar14 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x38);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xc) =
         *(undefined8 *)((long)(pnVar5 + local_500) + 0x30);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 0xe) = uVar14;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) = uVar12;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 10) = uVar13;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) = uVar10;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar11;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + local_500) + 0x40);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + local_500) + 0x44);
    uVar6 = *(undefined8 *)((long)(pnVar5 + local_500) + 0x48);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    pnVar5 = (pSVar25->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)((long)&pnVar5[local_500].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x10);
    uVar9 = *(undefined8 *)puVar1;
    uVar10 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x20);
    uVar11 = *(undefined8 *)puVar1;
    uVar12 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[local_500].m_backend.data + 0x30);
    uVar13 = *(undefined8 *)puVar1;
    uVar14 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)(enterRO->m_backend).data._M_elems =
         *(undefined8 *)&pnVar5[local_500].m_backend.data;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar6;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar9;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) = uVar11;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 10) = uVar12;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc) = uVar13;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe) = uVar14;
    iVar17 = pnVar5[local_500].m_backend.exp;
    (enterRO->m_backend).exp = iVar17;
    bVar16 = pnVar5[local_500].m_backend.neg;
    (enterRO->m_backend).neg = bVar16;
    fVar2 = pnVar5[local_500].m_backend.fpclass;
    (enterRO->m_backend).fpclass = fVar2;
    iVar3 = pnVar5[local_500].m_backend.prec_elem;
    (enterRO->m_backend).prec_elem = iVar3;
    (pSVar25->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.colstat.data[local_500] = D_UNDEFINED;
    local_448.fpclass = cpp_dec_float_finite;
    local_448.prec_elem = 0x10;
    local_448.data._M_elems[0] = 0;
    local_448.data._M_elems[1] = 0;
    local_448.data._M_elems[2] = 0;
    local_448.data._M_elems[3] = 0;
    local_448.data._M_elems[4] = 0;
    local_448.data._M_elems[5] = 0;
    local_448.data._M_elems[6] = 0;
    local_448.data._M_elems[7] = 0;
    local_448.data._M_elems[8] = 0;
    local_448.data._M_elems[9] = 0;
    local_448.data._M_elems[10] = 0;
    local_448.data._M_elems[0xb] = 0;
    local_448.data._M_elems[0xc] = 0;
    local_448.data._M_elems[0xd] = 0;
    local_448.data._M_elems._56_5_ = 0;
    local_448.data._M_elems[0xf]._1_3_ = 0;
    local_448.exp = 0;
    local_448.neg = false;
    if (&local_448 == &enterPric->m_backend) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                (&local_448,&enterRO->m_backend);
      if (local_448.data._M_elems[0] != 0 || local_448.fpclass != cpp_dec_float_finite) {
        local_448.neg = (bool)(local_448.neg ^ 1);
        goto LAB_003a124c;
      }
LAB_003a1256:
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_4f8,0,(type *)0x0);
      iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_448,&local_4f8);
      if (0 < iVar17) {
        ::soplex::infinity::__tls_init();
        uVar29 = (undefined4)*(undefined8 *)(in_FS_OFFSET + -8);
        uVar30 = (uint)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20);
        goto LAB_003a12ba;
      }
    }
    else {
      if (&local_448 != &enterRO->m_backend) {
        local_448.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_448.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_448.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        local_448.data._M_elems._24_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_448.data._M_elems._32_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_448.data._M_elems._40_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 10);
        local_448.data._M_elems._48_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xc);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 0xe);
        local_448.data._M_elems._56_5_ = SUB85(uVar6,0);
        local_448.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_448.prec_elem = iVar3;
        local_448.fpclass = fVar2;
        local_448.exp = iVar17;
        local_448.neg = bVar16;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                (&local_448,&enterPric->m_backend);
LAB_003a124c:
      if (local_448.fpclass != cpp_dec_float_NaN) goto LAB_003a1256;
    }
    ::soplex::infinity::__tls_init();
    uVar29 = (undefined4)*(undefined8 *)(in_FS_OFFSET + -8);
    uVar30 = (uint)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20) ^ 0x80000000;
LAB_003a12ba:
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x10;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems._56_5_ = 0;
    local_4f8.data._M_elems[0xf]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_4f8,(double)CONCAT44(uVar30,uVar29));
    *(undefined8 *)(enterMax->m_backend).data._M_elems = local_4f8.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_4f8.data._M_elems._8_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_4f8.data._M_elems._16_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 6) = local_4f8.data._M_elems._24_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 8) = local_4f8.data._M_elems._32_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 10) = local_4f8.data._M_elems._40_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc) = local_4f8.data._M_elems._48_8_;
    *(ulong *)((enterMax->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_4f8.data._M_elems[0xf]._1_3_,local_4f8.data._M_elems._56_5_);
    (enterMax->m_backend).exp = local_4f8.exp;
    (enterMax->m_backend).neg = local_4f8.neg;
    (enterMax->m_backend).fpclass = local_4f8.fpclass;
    (enterMax->m_backend).prec_elem = local_4f8.prec_elem;
    return;
  }
  *(undefined8 *)(pcVar23 + 0x48) = 0x1000000000;
  *(undefined8 *)pcVar23 = 0;
  *(undefined8 *)(pcVar23 + 8) = 0;
  *(undefined8 *)(pcVar23 + 0x10) = 0;
  *(undefined8 *)(pcVar23 + 0x18) = 0;
  *(undefined8 *)(pcVar23 + 0x20) = 0;
  *(undefined8 *)(pcVar23 + 0x28) = 0;
  *(undefined8 *)(pcVar23 + 0x30) = 0;
  *(undefined8 *)(pcVar23 + 0x38) = 0;
  *(undefined8 *)(pcVar23 + 0x3d) = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            (pcVar23,(double)CONCAT44(uVar31,uVar29));
  bVar16 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (pnVar27,pnVar28,
                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)pcVar23);
  pSVar21 = (pSVar25->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedesc.colstat.data;
LAB_003a201c:
  if (bVar16 == false) {
    pSVar21[local_500] = D_ON_BOTH;
  }
  else {
    pSVar21[local_500] = D_FREE;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::getEnterVals
(
   SPxId enterId,
   R& enterTest,
   R& enterUB,
   R& enterLB,
   R& enterVal,
   R& enterMax,
   R& enterPric,
   typename SPxBasisBase<R>::Desc::Status& enterStat,
   R& enterRO,
   StableSum<R>& objChange
)
{
   int enterIdx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(enterId.isSPxColId())
   {
      enterIdx = this->number(SPxColId(enterId));
      enterStat = ds.colStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == COLUMN)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterLB <= R(-infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterUB >= R(infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         enterMax = (enterRO - enterPric > 0) ? R(infinity) : R(-infinity);
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theUCbound[enterIdx] < R(infinity));
         enterUB = theUCbound[enterIdx];
         enterLB = R(-infinity);
         enterMax = R(-infinity);
         enterVal = enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::lower(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLCbound[enterIdx] > R(-infinity));
         enterLB = theLCbound[enterIdx];
         enterUB = R(infinity);
         enterMax = R(infinity);
         enterVal = enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::upper(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(SPxLPBase<R>::lower(enterIdx) == SPxLPBase<R>::upper(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterRO = SPxLPBase<R>::upper(enterIdx);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > enterRO)
            enterMax = R(infinity);
         else
            enterMax = R(-infinity);

         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > SPxLPBase<R>::upper(enterIdx))
         {
            enterLB = theLCbound[enterIdx];
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterVal = enterLB;
            enterRO = SPxLPBase<R>::upper(enterIdx);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theUCbound[enterIdx];
            enterVal = enterUB;
            enterRO = SPxLPBase<R>::lower(enterIdx);
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLCbound[enterIdx] * SPxLPBase<R>::upper(enterIdx);
         objChange -= theUCbound[enterIdx] * SPxLPBase<R>::lower(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER01 This should never happen.");
      }

      SPxOut::debug(this, "DENTER03 SPxSolverBase::getEnterVals() : col {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.colStatus(enterIdx), objChange);
   }

   else
   {
      assert(enterId.isSPxRowId());
      enterIdx = this->number(SPxRowId(enterId));
      enterStat = ds.rowStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == ROW)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterUB >= R(infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterLB <= R(-infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XENTER02 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER99 ERROR: not yet debugged!" << std::endl;)
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theURbound[enterIdx] < R(infinity));
         enterUB = theURbound[enterIdx];
         enterLB = R(-infinity);
         enterVal = enterUB;
         enterMax = R(-infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->lhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLRbound[enterIdx] > R(-infinity));
         enterLB = theLRbound[enterIdx];
         enterUB = R(infinity);
         enterVal = enterLB;
         enterMax = R(infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(this->rhs(enterIdx) == this->lhs(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         enterMax = (enterPric > enterRO) ? R(infinity) : R(-infinity);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*thePvec)[enterIdx];

         if(enterPric > this->rhs(enterIdx))
         {
            enterLB = theLRbound[enterIdx];
            enterVal = enterLB;
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterRO = this->rhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theURbound[enterIdx];
            enterVal = enterUB;
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            enterRO = this->lhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLRbound[enterIdx] * this->rhs(enterIdx);
         objChange -= theURbound[enterIdx] * this->lhs(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER03 This should never happen.");
      }

      SPxOut::debug(this, "DENTER05 SPxSolverBase::getEnterVals() : row {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.rowStatus(enterIdx), objChange);
   }
}